

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kriging.cpp
# Opt level: O0

void __thiscall
Kriging::Kriging(Kriging *this,vec *y,mat *X,string *covType,RegressionModel *regmodel,
                bool normalize,string *optim,string *objective,Parameters *parameters)

{
  runtime_error *this_00;
  int *in_RDX;
  long in_RSI;
  string *in_RDI;
  Kriging *this_01;
  Mat<double> *this_02;
  Mat<double> *this_03;
  byte in_R9B;
  string *in_stack_000058b0;
  undefined1 in_stack_000058bf;
  RegressionModel *in_stack_000058c0;
  mat *in_stack_000058c8;
  vec *in_stack_000058d0;
  Kriging *in_stack_000058d8;
  string *in_stack_00006b40;
  Parameters *in_stack_00006b48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd38;
  uint __val;
  string local_60 [55];
  byte local_29;
  int *local_18;
  long local_10;
  
  local_29 = in_R9B & 1;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::string::string(in_RDI);
  arma::Mat<double>::Mat((Mat<double> *)(in_RDI + 0x20));
  arma::Row<double>::Row((Row<double> *)in_stack_fffffffffffffd30);
  arma::Row<double>::Row((Row<double> *)in_stack_fffffffffffffd30);
  arma::Col<double>::Col((Col<double> *)in_stack_fffffffffffffd30);
  *(undefined8 *)(in_RDI + 0x2e0) = 0;
  *(undefined8 *)(in_RDI + 0x2e8) = 0;
  in_RDI[0x2f0] = (string)0x0;
  std::__cxx11::string::string(in_RDI + 0x2f8);
  std::__cxx11::string::string(in_RDI + 0x318);
  arma::Mat<double>::Mat((Mat<double> *)(in_RDI + 0x340));
  arma::Col<double>::Col((Col<double> *)in_stack_fffffffffffffd30);
  arma::Mat<double>::Mat((Mat<double> *)(in_RDI + 0x4a0));
  arma::Mat<double>::Mat((Mat<double> *)(in_RDI + 0x550));
  arma::Mat<double>::Mat((Mat<double> *)(in_RDI + 0x600));
  arma::Mat<double>::Mat((Mat<double> *)(in_RDI + 0x6b0));
  arma::Mat<double>::Mat((Mat<double> *)(in_RDI + 0x760));
  arma::Mat<double>::Mat((Mat<double> *)(in_RDI + 0x810));
  arma::Col<double>::Col((Col<double> *)in_stack_fffffffffffffd30);
  arma::Col<double>::Col((Col<double> *)in_stack_fffffffffffffd30);
  in_RDI[0xa20] = (string)0x0;
  arma::Col<double>::Col((Col<double> *)in_stack_fffffffffffffd30);
  in_RDI[0xae0] = (string)0x0;
  *(undefined8 *)(in_RDI + 0xae8) = 0;
  in_RDI[0xaf0] = (string)0x0;
  in_RDI[0xaf1] = (string)0x1;
  arma::Mat<double>::Mat((Mat<double> *)(in_RDI + 0xb00));
  arma::Mat<double>::Mat((Mat<double> *)(in_RDI + 0xbb0));
  *(undefined4 *)(in_RDI + 0xc60) = 0;
  *(undefined4 *)(in_RDI + 0xc64) = 0;
  arma::Mat<double>::Mat((Mat<double> *)(in_RDI + 0xc70));
  arma::Mat<double>::Mat((Mat<double> *)(in_RDI + 0xd20));
  arma::Mat<double>::Mat((Mat<double> *)(in_RDI + 0xdd0));
  arma::Mat<double>::Mat((Mat<double> *)(in_RDI + 0xe80));
  arma::Mat<double>::Mat((Mat<double> *)(in_RDI + 0xf30));
  arma::Mat<double>::Mat((Mat<double> *)(in_RDI + 0xfe0));
  arma::Mat<double>::Mat((Mat<double> *)(in_RDI + 0x1090));
  arma::Mat<double>::Mat((Mat<double> *)(in_RDI + 0x1140));
  arma::Mat<double>::Mat((Mat<double> *)(in_RDI + 0x11f0));
  arma::Mat<double>::Mat((Mat<double> *)(in_RDI + 0x12a0));
  arma::Mat<double>::Mat((Mat<double> *)(in_RDI + 0x1350));
  arma::Mat<double>::Mat((Mat<double> *)(in_RDI + 0x1400));
  arma::Mat<double>::Mat((Mat<double> *)(in_RDI + 0x14b0));
  arma::Mat<double>::Mat((Mat<double> *)(in_RDI + 0x1560));
  arma::Mat<double>::Mat((Mat<double> *)(in_RDI + 0x1610));
  this_01 = (Kriging *)(in_RDI + 0x16c0);
  arma::Mat<double>::Mat((Mat<double> *)this_01);
  this_02 = (Mat<double> *)(in_RDI + 6000);
  arma::Mat<double>::Mat(this_02);
  this_03 = (Mat<double> *)(in_RDI + 0x1820);
  arma::Mat<double>::Mat(this_03);
  std::function<double_(const_arma::Col<double>_&,_const_arma::Col<double>_&)>::function
            ((function<double_(const_arma::Col<double>_&,_const_arma::Col<double>_&)> *)
             in_stack_fffffffffffffd30);
  std::function<arma::Col<double>_(const_arma::Col<double>_&,_const_arma::Col<double>_&)>::function
            ((function<arma::Col<double>_(const_arma::Col<double>_&,_const_arma::Col<double>_&)> *)
             in_stack_fffffffffffffd30);
  __val = (uint)((ulong)(in_RDI + 0x1910) >> 0x20);
  std::function<arma::Col<double>_(const_arma::Col<double>_&,_const_arma::Col<double>_&)>::function
            ((function<arma::Col<double>_(const_arma::Col<double>_&,_const_arma::Col<double>_&)> *)
             in_stack_fffffffffffffd30);
  *(undefined8 *)(in_RDI + 0x1930) = 0;
  if (*(int *)(local_10 + 8) != *local_18) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(__val);
    std::operator+((char *)in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
    std::operator+(in_stack_fffffffffffffd38,(char *)in_stack_fffffffffffffd30);
    std::__cxx11::to_string(__val);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_03);
    std::operator+(in_stack_fffffffffffffd38,(char *)in_stack_fffffffffffffd30);
    std::__cxx11::to_string(__val);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_03);
    std::operator+(in_stack_fffffffffffffd38,(char *)in_stack_fffffffffffffd30);
    std::runtime_error::runtime_error(this_00,local_60);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  make_Cov(this_01,(string *)this_02);
  fit(in_stack_000058d8,in_stack_000058d0,in_stack_000058c8,in_stack_000058c0,
      (bool)in_stack_000058bf,in_stack_000058b0,in_stack_00006b40,in_stack_00006b48);
  return;
}

Assistant:

LIBKRIGING_EXPORT Kriging::Kriging(const arma::vec& y,
                                   const arma::mat& X,
                                   const std::string& covType,
                                   const Trend::RegressionModel& regmodel,
                                   bool normalize,
                                   const std::string& optim,
                                   const std::string& objective,
                                   const Parameters& parameters) {
  if (y.n_elem != X.n_rows)
    throw std::runtime_error("Dimension of new data should be the same:\n X: (" + std::to_string(X.n_rows) + "x"
                             + std::to_string(X.n_cols) + "), y: (" + std::to_string(y.n_elem) + ")");

  make_Cov(covType);
  fit(y, X, regmodel, normalize, optim, objective, parameters);
}